

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O0

void __thiscall
hiberlite::ExtractModel::putColumn<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,string *storage)

{
  string local_d8 [32];
  undefined1 local_b8 [48];
  undefined1 local_88 [40];
  Scope scope;
  string *storage_local;
  AVisitor<hiberlite::ExtractModel> *av_local;
  ExtractModel *this_local;
  
  scope._64_8_ = storage;
  AVisitor<hiberlite::ExtractModel>::getScope((Scope *)(local_88 + 0x20),av);
  Scope::table_abi_cxx11_((Scope *)local_88);
  Scope::prefix_abi_cxx11_((Scope *)local_b8);
  std::__cxx11::string::string(local_d8,(string *)storage);
  putNamedColumn(this,(string *)local_88,(string *)local_b8,(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_88);
  Scope::~Scope((Scope *)(local_88 + 0x20));
  return;
}

Assistant:

inline void putColumn(AV& av, std::string storage)
		{
			Scope scope=av.getScope();
			putNamedColumn(scope.table(), scope.prefix(), storage);
		}